

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-det.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  T TVar1;
  long lVar2;
  char *__assertion;
  initializer_list<long_long> __l;
  initializer_list<long_long> __l_00;
  initializer_list<long_long> __l_01;
  initializer_list<std::vector<long_long,_std::allocator<long_long>_>_> __l_02;
  initializer_list<long_long> __l_03;
  initializer_list<long_long> __l_04;
  initializer_list<std::vector<long_long,_std::allocator<long_long>_>_> __l_05;
  initializer_list<long_long> __l_06;
  initializer_list<long_long> __l_07;
  initializer_list<std::vector<long_long,_std::allocator<long_long>_>_> __l_08;
  allocator_type local_db;
  allocator_type local_da;
  allocator_type local_d9;
  _Vector_base<long_long,_std::allocator<long_long>_> local_d8;
  Matrix out;
  vector<long_long,_std::allocator<long_long>_> local_a8;
  vector<long_long,_std::allocator<long_long>_> local_90;
  Matrix c;
  longlong local_60 [2];
  Matrix a;
  Matrix b;
  
  b.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  b.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  b.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3;
  __l._M_len = 3;
  __l._M_array = (iterator)&b;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)&out,__l,(allocator_type *)local_60);
  c.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4;
  c.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x5;
  c.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x6;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&c;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_a8,__l_00,&local_db);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x7;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x8;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x9;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_d8;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_90,__l_01,&local_da);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&out;
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector(&a,__l_02,&local_d9);
  lVar2 = 0x30;
  do {
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)
               ((long)&out.
                       super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  c.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7;
  c.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x8;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&c;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)&out,__l_03,(allocator_type *)local_60
            );
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x9;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0xa;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_d8;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_a8,__l_04,&local_db);
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&out;
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector(&b,__l_05,(allocator_type *)&local_da);
  lVar2 = 0x18;
  do {
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)
               ((long)&out.
                       super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3a;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x40;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&local_d8;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)&out,__l_06,&local_db);
  local_60[0] = 0x8b;
  local_60[1] = 0x9a;
  __l_07._M_len = 2;
  __l_07._M_array = local_60;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_a8,__l_07,&local_da);
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&out;
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector(&c,__l_08,&local_d9);
  lVar2 = 0x18;
  do {
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)
               ((long)&out.
                       super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)&local_d8,
             (long)((a.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)((a.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)local_60);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector(&out,((long)a.
                       super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)a.
                      super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18,(value_type *)&local_d8,
           (allocator_type *)&local_db);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base(&local_d8);
  TVar1 = det(&a);
  if (TVar1 == 0) {
    TVar1 = det(&b);
    if (TVar1 == -2) {
      TVar1 = det(&c);
      if (TVar1 == 0x24) {
        std::
        vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
        ::~vector(&out);
        std::
        vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
        ::~vector(&c);
        std::
        vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
        ::~vector(&b);
        std::
        vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
        ::~vector(&a);
        return 0;
      }
      __assertion = "det(c) == 36";
      __line = 0x2b;
    }
    else {
      __assertion = "det(b) == -2";
      __line = 0x2a;
    }
  }
  else {
    __assertion = "det(a) == 0";
    __line = 0x29;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/drathier[P]compprogcheatsheet/code/math/matrix-det.cpp"
                ,__line,"int main()");
}

Assistant:

int main() {
	Matrix a({{1, 2, 3},
						 {4, 5, 6},
						 {7, 8, 9}});
	Matrix b({{7, 8},
						 {9, 10}});
	Matrix c({{58,  64},
						 {139, 154}});
	Matrix out(a.size(), Row(a[0].size()));

	assert(det(a) == 0);
	assert(det(b) == -2);
	assert(det(c) == 36);

	return 0;
}